

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O1

BigPropertyIndex __thiscall
Js::SimpleTypeHandler<1UL>::GetPropertyIndex_EnumerateTTD
          (SimpleTypeHandler<1UL> *this,PropertyRecord *pRecord)

{
  int iVar1;
  bool bVar2;
  uint uVar3;
  uint in_EAX;
  uint uVar4;
  
  iVar1 = this->propertyCount;
  bVar2 = 0 < iVar1;
  if (0 < iVar1) {
    if ((this->descriptors[0].Id.ptr)->pid == pRecord->pid) {
      bVar2 = true;
      in_EAX = 0;
    }
    else {
      uVar3 = 1;
      do {
        in_EAX = uVar3;
        uVar4 = in_EAX & 0xffff;
        bVar2 = (int)uVar4 < iVar1;
        if (iVar1 <= (int)uVar4) break;
        uVar3 = uVar4 + 1;
      } while (*(int *)(*(long *)((long)&this->descriptors[0].Id.ptr + (ulong)(uVar4 << 4)) + 8) !=
               pRecord->pid);
    }
  }
  if (!bVar2) {
    TTDAbort_unrecoverable_error("We found this during enum so what is going on here?");
  }
  if ((*(byte *)((long)&this->descriptors[0].field_1 + (ulong)((in_EAX & 0xffff) << 4)) & 8) != 0) {
    TTDAbort_unrecoverable_error("How is this deleted but we enumerated it anyway???");
  }
  return in_EAX & 0xffff;
}

Assistant:

Js::BigPropertyIndex SimpleTypeHandler<size>::GetPropertyIndex_EnumerateTTD(const Js::PropertyRecord* pRecord)
    {
        PropertyIndex index;
        if(this->GetDescriptor(pRecord->GetPropertyId(), &index))
        {
            TTDAssert(!(this->descriptors[index].Attributes & PropertyDeleted), "How is this deleted but we enumerated it anyway???");

            return (Js::BigPropertyIndex)index;
        }

        TTDAssert(false, "We found this during enum so what is going on here?");
        return Js::Constants::NoBigSlot;
    }